

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O0

size_t google::protobuf::internal::
       MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
       ::ByteSizeLong(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
                     Function *value)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  size_t inner_length;
  Function *value_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_local;
  
  iVar1 = MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)9,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::ByteSize(key);
  sVar2 = MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)11,_CoreML::Specification::MILSpec::Function>
          ::ByteSize(value);
  lVar3 = (long)(iVar1 + 2) + sVar2;
  sVar2 = io::CodedOutputStream::VarintSize32((uint32_t)lVar3);
  return lVar3 + sVar2;
}

Assistant:

static size_t ByteSizeLong(const Key& key, const Value& value) {
    // Tags for key and value will both be one byte (field numbers 1 and 2).
    size_t inner_length =
        2 + KeyTypeHandler::ByteSize(key) + ValueTypeHandler::ByteSize(value);
    return inner_length + io::CodedOutputStream::VarintSize32(
                              static_cast<uint32_t>(inner_length));
  }